

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

bool sb_update_header(fdb_kvs_handle *handle)

{
  long lVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  __int_type _Var4;
  atomic<unsigned_long> *atomic_val;
  long in_RDI;
  uint64_t lw_revnum;
  bid_t last_hdr_bid;
  superblock *sb;
  bool ret;
  undefined4 in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffbc;
  atomic<unsigned_long> *in_stack_ffffffffffffffc0;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffc8;
  undefined1 local_9;
  
  local_9 = false;
  lVar1 = *(long *)(*(long *)(in_RDI + 0x48) + 0x198);
  uVar2 = atomic_get_uint64_t(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  if (lVar1 != 0) {
    uVar3 = atomic_get_uint64_t(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (uVar3 != uVar2) {
      uVar2 = atomic_get_uint64_t(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffc8);
      if (uVar2 < _Var4) {
        atomic_store_uint64_t
                  (in_stack_ffffffffffffffc0,
                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   memory_order_relaxed);
        atomic_val = (atomic<unsigned_long> *)(lVar1 + 0xb0);
        std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffc8);
        atomic_store_uint64_t
                  (atomic_val,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                   memory_order_relaxed);
        uVar2 = atomic_get_uint64_t(atomic_val,in_stack_ffffffffffffffbc);
        uVar3 = atomic_get_uint64_t(atomic_val,in_stack_ffffffffffffffbc);
        if ((uVar2 == uVar3) && (*(long *)(lVar1 + 0x48) != 0)) {
          free(*(void **)(lVar1 + 0x48));
          *(undefined8 *)(lVar1 + 0x48) = 0;
        }
        local_9 = true;
      }
    }
  }
  return local_9;
}

Assistant:

bool sb_update_header(fdb_kvs_handle *handle)
{
    bool ret = false;
    struct superblock *sb = handle->file->sb;

    bid_t last_hdr_bid = atomic_get_uint64_t(&handle->last_hdr_bid);
    if (sb && atomic_get_uint64_t(&sb->last_hdr_bid) != last_hdr_bid &&
        atomic_get_uint64_t(&sb->last_hdr_revnum) < handle->cur_header_revnum) {

        atomic_store_uint64_t(&sb->last_hdr_bid, last_hdr_bid);
        atomic_store_uint64_t(&sb->last_hdr_revnum, handle->cur_header_revnum);

        uint64_t lw_revnum = atomic_get_uint64_t(&handle->file->last_writable_bmp_revnum);
        if (lw_revnum == atomic_get_uint64_t(&sb->bmp_revnum) &&
            sb->bmp_prev) {
            free(sb->bmp_prev);
            sb->bmp_prev = NULL;
        }
        ret = true;
    }

    return ret;
}